

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     VisitArguments<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>>
               (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                *item,function<void_(int)> *argv)

{
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *in_RSI;
  long in_RDI;
  function<void_(int)> *in_stack_ffffffffffffffc0;
  function<void_(int)> *in_stack_ffffffffffffffe8;
  
  CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
  ::GetArguments((CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                  *)(in_RDI + 0x28));
  std::function<void_(int)>::function
            (in_stack_ffffffffffffffc0,(function<void_(int)> *)&stack0xffffffffffffffd0);
  VisitArguments<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>
            (in_RSI,in_stack_ffffffffffffffe8);
  std::function<void_(int)>::~function((function<void_(int)> *)0x287383);
  return;
}

Assistant:

inline void VisitArguments(const Item& item, std::function<void (int)> argv) {
  VisitArguments(item.GetArguments(), argv);      // redirect to the arguments' visitor
}